

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

TestCaseProperties __thiscall
Catch::anon_unknown_26::parseSpecialTag(anon_unknown_26 *this,StringRef tag)

{
  bool bVar1;
  char cVar2;
  StringRef SVar3;
  undefined1 local_20 [8];
  StringRef tag_local;
  
  tag_local.m_start = tag.m_start;
  local_20 = (undefined1  [8])this;
  bVar1 = StringRef::empty((StringRef *)local_20);
  if ((!bVar1) && (cVar2 = StringRef::operator[]((StringRef *)local_20,0), cVar2 == '.')) {
    return IsHidden;
  }
  SVar3 = operator____sr("!throws",7);
  bVar1 = StringRef::operator==((StringRef *)local_20,SVar3);
  if (bVar1) {
    tag_local.m_size._7_1_ = Throws;
  }
  else {
    SVar3 = operator____sr("!shouldfail",0xb);
    bVar1 = StringRef::operator==((StringRef *)local_20,SVar3);
    if (bVar1) {
      tag_local.m_size._7_1_ = ShouldFail;
    }
    else {
      SVar3 = operator____sr("!mayfail",8);
      bVar1 = StringRef::operator==((StringRef *)local_20,SVar3);
      if (bVar1) {
        tag_local.m_size._7_1_ = MayFail;
      }
      else {
        SVar3 = operator____sr("!nonportable",0xc);
        bVar1 = StringRef::operator==((StringRef *)local_20,SVar3);
        if (bVar1) {
          tag_local.m_size._7_1_ = NonPortable;
        }
        else {
          SVar3 = operator____sr("!benchmark",10);
          bVar1 = StringRef::operator==((StringRef *)local_20,SVar3);
          if (bVar1) {
            tag_local.m_size._7_1_ = operator|(Benchmark,IsHidden);
          }
          else {
            tag_local.m_size._7_1_ = None;
          }
        }
      }
    }
  }
  return tag_local.m_size._7_1_;
}

Assistant:

TestCaseProperties parseSpecialTag( StringRef tag ) {
            if( !tag.empty() && tag[0] == '.' )
                return TestCaseProperties::IsHidden;
            else if( tag == "!throws"_sr )
                return TestCaseProperties::Throws;
            else if( tag == "!shouldfail"_sr )
                return TestCaseProperties::ShouldFail;
            else if( tag == "!mayfail"_sr )
                return TestCaseProperties::MayFail;
            else if( tag == "!nonportable"_sr )
                return TestCaseProperties::NonPortable;
            else if( tag == "!benchmark"_sr )
                return TestCaseProperties::Benchmark | TestCaseProperties::IsHidden;
            else
                return TestCaseProperties::None;
        }